

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O2

void sznet::net::detail::removeKcpConnection(EventLoop *loop,KcpConnectionPtr *conn)

{
  code *local_68;
  undefined8 local_60;
  _Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()> local_58;
  Functor local_38;
  
  local_68 = KcpConnection::connectDestroyed;
  local_60 = 0;
  std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>::
  _Bind<std::shared_ptr<sznet::net::KcpConnection>const&>
            ((_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>
              *)&local_58,(offset_in_KcpConnection_to_subr *)&local_68,conn);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>,void>
            ((function<void()> *)&local_38,&local_58);
  EventLoop::queueInLoop(loop,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_58._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<sznet::net::KcpConnection>_>.
                     super__Head_base<0UL,_std::shared_ptr<sznet::net::KcpConnection>,_false>.
                     _M_head_impl.
                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> + 8))
  ;
  return;
}

Assistant:

void removeKcpConnection(EventLoop* loop, const KcpConnectionPtr& conn)
{
	loop->queueInLoop(std::bind(&KcpConnection::connectDestroyed, conn));
}